

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

void Pla_ManConvertFromBits(Pla_Man_t *p)

{
  Vec_Wec_t *p_00;
  Vec_Wec_t *p_01;
  word *pwVar1;
  Vec_Int_t *p_02;
  ulong uVar2;
  byte bVar3;
  int i;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int Entry;
  ulong uVar7;
  
  p_00 = &p->vCubeLits;
  Vec_WecClear(p_00);
  p_01 = &p->vOccurs;
  Vec_WecClear(p_01);
  Vec_WecInit(p_00,(p->vCubes).nSize);
  Vec_WecInit(p_01,p->nIns * 2);
  i = 0;
  do {
    if ((p->vCubes).nSize <= i) {
      return;
    }
    pwVar1 = Pla_CubeIn(p,i);
    p_02 = Vec_WecEntry(p_00,i);
    uVar6 = p->nIns;
    bVar3 = 0;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    iVar4 = 0;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      iVar4 = (iVar4 + 1) - (uint)((pwVar1[uVar5 >> 5] >> (bVar3 & 0x3e) & 3) == 0);
      bVar3 = bVar3 + 2;
    }
    Vec_IntGrow(p_02,iVar4);
    iVar4 = 0;
    for (uVar7 = 0; (int)uVar7 < p->nIns; uVar7 = (ulong)((int)uVar7 + 1)) {
      uVar2 = pwVar1[uVar7 >> 5] >> ((byte)iVar4 & 0x3e);
      if ((uVar2 & 3) != 0) {
        Entry = (uint)(((uint)uVar2 & 3) == 1) + iVar4;
        Vec_WecPush(p_00,i,Entry);
        Vec_WecPush(p_01,Entry,i);
      }
      iVar4 = iVar4 + 2;
    }
    i = i + 1;
  } while (p_02->nSize == p_02->nCap);
  __assert_fail("Vec_IntSize(vCube) == Vec_IntCap(vCube)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                ,0xf8,"void Pla_ManConvertFromBits(Pla_Man_t *)");
}

Assistant:

void Pla_ManConvertFromBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube;
    word * pCube; int i, k, Lit, Count;
    Vec_WecClear( &p->vCubeLits );
    Vec_WecClear( &p->vOccurs );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Pla_ForEachCubeIn( p, pCube, i )
    {
        vCube = Vec_WecEntry( &p->vCubeLits, i );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
                Count++;
        Vec_IntGrow( vCube, Count );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
//                Vec_WecPush( &p->vOccurs, Lit, Pla_CubeHandle(i, Count++) );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
        assert( Vec_IntSize(vCube) == Vec_IntCap(vCube) );
    }
}